

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O2

int rne(int x)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  while( true ) {
    if (iVar2 == 10) {
      return iVar2;
    }
    iVar1 = rnf(2,x + 2);
    if (iVar1 == 0) break;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static inline int rne(int x)
{
	int n;

	n = 1;
	/* Slightly higher probabilities for higher n than in NetHack 3.4.3
	 * p(n) = \left(\frac{2}{x+2}\right)^{n-1} \frac{x}{x+2} */
	while (n < 10 && rnf(2, x + 2))
		n++;
	return n;
}